

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Texture.cpp
# Opt level: O1

void __thiscall sf::Texture::setRepeated(Texture *this,bool repeated)

{
  ostream *poVar1;
  GLint GVar2;
  TransientContextLock lock;
  TextureSaver save;
  TransientContextLock local_2d;
  TextureSaver local_2c;
  
  if ((this->m_isRepeated != repeated) && (this->m_isRepeated = repeated, this->m_texture != 0)) {
    GlResource::TransientContextLock::TransientContextLock(&local_2d);
    priv::TextureSaver::TextureSaver(&local_2c);
    if (setRepeated(bool)::textureEdgeClamp == '\0') {
      setRepeated();
    }
    if (((this->m_isRepeated == false) && (setRepeated::textureEdgeClamp == false)) &&
       (setRepeated(bool)::warned == '\0')) {
      poVar1 = err();
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar1,"OpenGL extension SGIS_texture_edge_clamp unavailable",0x34);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
      std::ostream::put((char)poVar1);
      std::ostream::flush();
      poVar1 = err();
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar1,"Artifacts may occur along texture edges",0x27);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
      std::ostream::put((char)poVar1);
      std::ostream::flush();
      poVar1 = err();
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar1,"Ensure that hardware acceleration is enabled if available",0x39);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
      std::ostream::put((char)poVar1);
      std::ostream::flush();
      setRepeated(bool)::warned = '\x01';
    }
    (*sf_glad_glBindTexture)(0xde1,this->m_texture);
    GVar2 = 0x2900;
    if ((setRepeated::textureEdgeClamp & 1U) != 0) {
      GVar2 = 0x812f;
    }
    if (this->m_isRepeated != false) {
      GVar2 = 0x2901;
    }
    (*sf_glad_glTexParameteri)(0xde1,0x2802,GVar2);
    GVar2 = 0x2900;
    if ((setRepeated::textureEdgeClamp & 1U) != 0) {
      GVar2 = 0x812f;
    }
    if (this->m_isRepeated != false) {
      GVar2 = 0x2901;
    }
    (*sf_glad_glTexParameteri)(0xde1,0x2803,GVar2);
    priv::TextureSaver::~TextureSaver(&local_2c);
    GlResource::TransientContextLock::~TransientContextLock(&local_2d);
  }
  return;
}

Assistant:

void Texture::setRepeated(bool repeated)
{
    if (repeated != m_isRepeated)
    {
        m_isRepeated = repeated;

        if (m_texture)
        {
            TransientContextLock lock;

            // Make sure that the current texture binding will be preserved
            priv::TextureSaver save;

            static bool textureEdgeClamp = GLEXT_texture_edge_clamp;

            if (!m_isRepeated && !textureEdgeClamp)
            {
                static bool warned = false;

                if (!warned)
                {
                    err() << "OpenGL extension SGIS_texture_edge_clamp unavailable" << std::endl;
                    err() << "Artifacts may occur along texture edges" << std::endl;
                    err() << "Ensure that hardware acceleration is enabled if available" << std::endl;

                    warned = true;
                }
            }

            glCheck(glBindTexture(GL_TEXTURE_2D, m_texture));
            glCheck(glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, m_isRepeated ? GL_REPEAT : (textureEdgeClamp ? GLEXT_GL_CLAMP_TO_EDGE : GLEXT_GL_CLAMP)));
            glCheck(glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, m_isRepeated ? GL_REPEAT : (textureEdgeClamp ? GLEXT_GL_CLAMP_TO_EDGE : GLEXT_GL_CLAMP)));
        }
    }
}